

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O3

void __thiscall leveldb::MemTableIterator::Seek(MemTableIterator *this,Slice *k)

{
  Node *pNVar1;
  long in_FS_OFFSET;
  pointer local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (this->tmp_)._M_string_length = 0;
  *(this->tmp_)._M_dataplus._M_p = '\0';
  PutVarint32(&this->tmp_,(uint32_t)k->size_);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&this->tmp_,k->data_,k->size_);
  local_28 = (this->tmp_)._M_dataplus._M_p;
  pNVar1 = SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindGreaterOrEqual
                     ((this->iter_).list_,&local_28,(Node **)0x0);
  (this->iter_).node_ = pNVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Seek(const Slice& k) override { iter_.Seek(EncodeKey(&tmp_, k)); }